

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::warning(string *baseMessage,string *detailMessage)

{
  bool bVar1;
  __type _Var2;
  string *in_RSI;
  WarningMessage *in_RDI;
  WarningMessage *w;
  iterator __end1;
  iterator __begin1;
  deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
  *__range1;
  bool found;
  _Self *in_stack_ffffffffffffff28;
  value_type *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_90 [32];
  int local_70;
  reference local_68;
  _Deque_iterator<polyscope::(anonymous_namespace)::WarningMessage,_polyscope::(anonymous_namespace)::WarningMessage_&,_polyscope::(anonymous_namespace)::WarningMessage_*>
  local_40;
  undefined1 *local_20;
  byte local_11;
  
  local_11 = 0;
  local_20 = (anonymous_namespace)::warningMessages;
  std::
  deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
  ::begin((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
           *)in_stack_ffffffffffffff28);
  std::
  deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
  ::end((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
         *)in_stack_ffffffffffffff28);
  while (bVar1 = std::operator!=((_Self *)in_RDI,in_stack_ffffffffffffff28), bVar1) {
    local_68 = std::
               _Deque_iterator<polyscope::(anonymous_namespace)::WarningMessage,_polyscope::(anonymous_namespace)::WarningMessage_&,_polyscope::(anonymous_namespace)::WarningMessage_*>
               ::operator*(&local_40);
    _Var2 = std::operator==(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (_Var2) {
      local_11 = 1;
      local_68->repeatCount = local_68->repeatCount + 1;
    }
    std::
    _Deque_iterator<polyscope::(anonymous_namespace)::WarningMessage,_polyscope::(anonymous_namespace)::WarningMessage_&,_polyscope::(anonymous_namespace)::WarningMessage_*>
    ::operator++((_Deque_iterator<polyscope::(anonymous_namespace)::WarningMessage,_polyscope::(anonymous_namespace)::WarningMessage_&,_polyscope::(anonymous_namespace)::WarningMessage_*>
                  *)in_RDI);
  }
  if ((local_11 & 1) == 0) {
    __x = (value_type *)&stack0xffffffffffffff50;
    std::__cxx11::string::string((string *)__x,(string *)in_RDI);
    std::__cxx11::string::string(local_90,in_RSI);
    local_70 = 0;
    std::
    deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
    ::push_back((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                 *)in_RDI,__x);
    anon_unknown_1::WarningMessage::~WarningMessage(in_RDI);
  }
  return;
}

Assistant:

void warning(std::string baseMessage, std::string detailMessage) {

  // Look for a message with the same name
  bool found = false;
  for (WarningMessage& w : warningMessages) {
    if (w.baseMessage == baseMessage) {
      found = true;
      w.repeatCount++;
    }
  }

  // Create a new message
  if (!found) {
    warningMessages.push_back(WarningMessage{baseMessage, detailMessage, 0});
  }
}